

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O3

void cfl_subsample_hbd_420_32x32_ssse3(uint16_t *cfl_type,int input_stride,uint16_t *output_q3)

{
  uint16_t *puVar1;
  short *psVar2;
  ulong uVar3;
  uint16_t *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  puVar4 = cfl_type + 0x18;
  uVar3 = 0xffffffffffffffc0;
  do {
    puVar1 = puVar4 + (long)input_stride + -0x18;
    auVar6._0_2_ = *puVar1 + puVar4[-0x18];
    auVar6._2_2_ = puVar1[1] + puVar4[-0x17];
    auVar6._4_2_ = puVar1[2] + puVar4[-0x16];
    auVar6._6_2_ = puVar1[3] + puVar4[-0x15];
    auVar6._8_2_ = puVar1[4] + puVar4[-0x14];
    auVar6._10_2_ = puVar1[5] + puVar4[-0x13];
    auVar6._12_2_ = puVar1[6] + puVar4[-0x12];
    auVar6._14_2_ = puVar1[7] + puVar4[-0x11];
    puVar1 = puVar4 + (long)input_stride + -0x10;
    auVar7._0_2_ = *puVar1 + puVar4[-0x10];
    auVar7._2_2_ = puVar1[1] + puVar4[-0xf];
    auVar7._4_2_ = puVar1[2] + puVar4[-0xe];
    auVar7._6_2_ = puVar1[3] + puVar4[-0xd];
    auVar7._8_2_ = puVar1[4] + puVar4[-0xc];
    auVar7._10_2_ = puVar1[5] + puVar4[-0xb];
    auVar7._12_2_ = puVar1[6] + puVar4[-10];
    auVar7._14_2_ = puVar1[7] + puVar4[-9];
    auVar7 = phaddw(auVar6,auVar7);
    psVar2 = (short *)((long)output_q3 + uVar3 + 0x40);
    *psVar2 = auVar7._0_2_ * 2;
    psVar2[1] = auVar7._2_2_ * 2;
    psVar2[2] = auVar7._4_2_ * 2;
    psVar2[3] = auVar7._6_2_ * 2;
    psVar2[4] = auVar7._8_2_ * 2;
    psVar2[5] = auVar7._10_2_ * 2;
    psVar2[6] = auVar7._12_2_ * 2;
    psVar2[7] = auVar7._14_2_ * 2;
    puVar1 = puVar4 + (long)input_stride + -8;
    auVar8._0_2_ = *puVar1 + puVar4[-8];
    auVar8._2_2_ = puVar1[1] + puVar4[-7];
    auVar8._4_2_ = puVar1[2] + puVar4[-6];
    auVar8._6_2_ = puVar1[3] + puVar4[-5];
    auVar8._8_2_ = puVar1[4] + puVar4[-4];
    auVar8._10_2_ = puVar1[5] + puVar4[-3];
    auVar8._12_2_ = puVar1[6] + puVar4[-2];
    auVar8._14_2_ = puVar1[7] + puVar4[-1];
    puVar1 = puVar4 + input_stride;
    auVar5._0_2_ = *puVar1 + *puVar4;
    auVar5._2_2_ = puVar1[1] + puVar4[1];
    auVar5._4_2_ = puVar1[2] + puVar4[2];
    auVar5._6_2_ = puVar1[3] + puVar4[3];
    auVar5._8_2_ = puVar1[4] + puVar4[4];
    auVar5._10_2_ = puVar1[5] + puVar4[5];
    auVar5._12_2_ = puVar1[6] + puVar4[6];
    auVar5._14_2_ = puVar1[7] + puVar4[7];
    auVar7 = phaddw(auVar8,auVar5);
    psVar2 = (short *)((long)output_q3 + uVar3 + 0x50);
    *psVar2 = auVar7._0_2_ * 2;
    psVar2[1] = auVar7._2_2_ * 2;
    psVar2[2] = auVar7._4_2_ * 2;
    psVar2[3] = auVar7._6_2_ * 2;
    psVar2[4] = auVar7._8_2_ * 2;
    psVar2[5] = auVar7._10_2_ * 2;
    psVar2[6] = auVar7._12_2_ * 2;
    psVar2[7] = auVar7._14_2_ * 2;
    uVar3 = uVar3 + 0x40;
    puVar4 = puVar4 + input_stride * 2;
  } while (uVar3 < 0x3c0);
  return;
}

Assistant:

static inline void cfl_luma_subsampling_420_hbd_ssse3(const uint16_t *input,
                                                      int input_stride,
                                                      uint16_t *pred_buf_q3,
                                                      int width, int height) {
  const uint16_t *end = pred_buf_q3 + (height >> 1) * CFL_BUF_LINE;
  const int luma_stride = input_stride << 1;
  do {
    if (width == 4) {
      const __m128i top = _mm_loadl_epi64((__m128i *)input);
      const __m128i bot = _mm_loadl_epi64((__m128i *)(input + input_stride));
      __m128i sum = _mm_add_epi16(top, bot);
      sum = _mm_hadd_epi16(sum, sum);
      *((int *)pred_buf_q3) = _mm_cvtsi128_si32(_mm_add_epi16(sum, sum));
    } else {
      const __m128i top = _mm_loadu_si128((__m128i *)input);
      const __m128i bot = _mm_loadu_si128((__m128i *)(input + input_stride));
      __m128i sum = _mm_add_epi16(top, bot);
      if (width == 8) {
        sum = _mm_hadd_epi16(sum, sum);
        _mm_storel_epi64((__m128i *)pred_buf_q3, _mm_add_epi16(sum, sum));
      } else {
        const __m128i top_1 = _mm_loadu_si128(((__m128i *)input) + 1);
        const __m128i bot_1 =
            _mm_loadu_si128(((__m128i *)(input + input_stride)) + 1);
        sum = _mm_hadd_epi16(sum, _mm_add_epi16(top_1, bot_1));
        _mm_storeu_si128((__m128i *)pred_buf_q3, _mm_add_epi16(sum, sum));
        if (width == 32) {
          const __m128i top_2 = _mm_loadu_si128(((__m128i *)input) + 2);
          const __m128i bot_2 =
              _mm_loadu_si128(((__m128i *)(input + input_stride)) + 2);
          const __m128i top_3 = _mm_loadu_si128(((__m128i *)input) + 3);
          const __m128i bot_3 =
              _mm_loadu_si128(((__m128i *)(input + input_stride)) + 3);
          const __m128i sum_2 = _mm_add_epi16(top_2, bot_2);
          const __m128i sum_3 = _mm_add_epi16(top_3, bot_3);
          __m128i next_sum = _mm_hadd_epi16(sum_2, sum_3);
          _mm_storeu_si128(((__m128i *)pred_buf_q3) + 1,
                           _mm_add_epi16(next_sum, next_sum));
        }
      }
    }
    input += luma_stride;
  } while ((pred_buf_q3 += CFL_BUF_LINE) < end);
}